

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O2

void __thiscall Assimp::Q3BSPFileImporter::~Q3BSPFileImporter(Q3BSPFileImporter *this)

{
  _Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *this_00;
  _Base_ptr p_Var1;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_007f8eb8;
  this->m_pCurrentMesh = (aiMesh *)0x0;
  this->m_pCurrentFace = (aiFace *)0x0;
  for (p_Var1 = (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      this_00 = *(_Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                  **)(p_Var1 + 2);
      if (this_00 !=
          (_Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *
          )0x0) {
        std::_Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
        ::~_Vector_base(this_00);
      }
      operator_delete(this_00,0x18);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
  ::clear(&(this->m_MaterialLookupMap)._M_t);
  std::_Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>::~_Vector_base
            (&(this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>_*>_>_>
  ::~_Rb_tree(&(this->m_MaterialLookupMap)._M_t);
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

Q3BSPFileImporter::~Q3BSPFileImporter() {
    m_pCurrentMesh = nullptr;
    m_pCurrentFace = nullptr;

    // Clear face-to-material map
    for ( FaceMap::iterator it = m_MaterialLookupMap.begin(); it != m_MaterialLookupMap.end(); ++it ) {
        const std::string &matName = it->first;
        if ( !matName.empty() ) {
            delete it->second;
        }
    }
    m_MaterialLookupMap.clear();
}